

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

Value __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeObject<jsonnet::internal::(anonymous_namespace)::HeapSimpleObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>>>,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>>
          (Interpreter *this,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args,map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                *args_1,
          list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *args_2)

{
  undefined8 uVar1;
  Interpreter IVar2;
  _List_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  HeapEntity *pHVar5;
  anon_union_8_3_4e909c26_for_v aVar6;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  _Link_type __x;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Value VVar9;
  undefined1 local_78 [48];
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  *local_48;
  
  __x = (_Link_type)local_78;
  VVar9._0_8_ = (_Base_ptr)operator_new(0x88);
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
         *)(local_78 + 0x20),args_1);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::list
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)local_78,
             args_2);
  *(Type *)((long)&(VVar9._0_8_)->_M_parent + 1) = SIMPLE_OBJECT;
  *(undefined ***)VVar9._0_8_ = &PTR__HeapSimpleObject_002377b8;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)&(VVar9._0_8_)->_M_left,args);
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
         *)(VVar9._0_8_ + 2),
        (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
         *)(local_78 + 0x20));
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::list
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
             &VVar9._0_8_[3]._M_left,
             (list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)local_78);
  if ((_List_node_base *)local_78._0_8_ != (_List_node_base *)local_78) {
    do {
      p_Var3 = ((_List_node_base *)local_78._0_8_)->_M_next;
      __x = (_Link_type)&DAT_00000018;
      operator_delete((void *)local_78._0_8_,0x18);
      local_78._0_8_ = p_Var3;
    } while (p_Var3 != (_List_node_base *)local_78);
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  ::_M_erase(local_48,__x);
  local_78._24_8_ = VVar9._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)(this + 0x18),(value_type *)(local_78 + 0x18));
  IVar2 = this[0x10];
  *(Interpreter *)&(VVar9._0_8_)->_M_parent = IVar2;
  pHVar5 = (HeapEntity *)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3);
  *(HeapEntity **)(this + 0x38) = pHVar5;
  aVar6._4_4_ = 0;
  aVar6._0_4_ = *(uint *)this;
  if ((aVar6.h < pHVar5) &&
     (auVar7._8_4_ = (int)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 0x23),
     auVar7._0_8_ = pHVar5, auVar7._12_4_ = 0x45300000, uVar1 = *(undefined8 *)(this + 0x30),
     auVar8._8_4_ = (int)((ulong)uVar1 >> 0x20), auVar8._0_8_ = uVar1, auVar8._12_4_ = 0x45300000,
     ((auVar8._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * *(double *)(this + 8) <
     (auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)pHVar5) - 4503599627370496.0))) {
    anon_unknown_0::Heap::markFrom((Heap *)(ulong)(byte)IVar2,(HeapEntity *)VVar9._0_8_);
    anon_unknown_0::Stack::mark(*(Stack **)(this + 0x60),*(Heap **)(this + 0x68));
    if (((byte)this[0x40] & 0x10) != 0) {
      anon_unknown_0::Heap::markFrom
                ((Heap *)(ulong)*(uint *)(this + 0x10),*(HeapEntity **)(this + 0x48));
    }
    for (p_Var4 = *(_Rb_tree_node_base **)(this + 0xe0);
        p_Var4 != (_Rb_tree_node_base *)(this + 0xd0);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if (*(HeapEntity **)(*(long *)(p_Var4 + 3) + 0x40) != (HeapEntity *)0x0) {
        anon_unknown_0::Heap::markFrom
                  ((Heap *)(ulong)*(uint *)(this + 0x10),
                   *(HeapEntity **)(*(long *)(p_Var4 + 3) + 0x40));
      }
    }
    for (p_Var4 = *(_Rb_tree_node_base **)(this + 0x1b0);
        p_Var4 != (_Rb_tree_node_base *)(this + 0x1a0);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      anon_unknown_0::Heap::markFrom
                ((Heap *)(ulong)*(uint *)(this + 0x10),*(HeapEntity **)(p_Var4 + 2));
    }
    anon_unknown_0::Heap::sweep((Heap *)this);
    aVar6 = extraout_RDX;
  }
  VVar9.v.h = aVar6.h;
  return VVar9;
}

Assistant:

Value makeObject(Args... args)
    {
        Value r;
        r.t = Value::OBJECT;
        r.v.h = makeHeap<T>(args...);
        return r;
    }